

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int nni_thr_init(nni_thr *thr,nni_thr_func fn,void *arg)

{
  int rv;
  void *arg_local;
  nni_thr_func fn_local;
  nni_thr *thr_local;
  
  thr->done = 0;
  thr->start = 0;
  thr->stop = 0;
  thr->fn = fn;
  thr->arg = arg;
  nni_plat_mtx_init(&thr->mtx);
  nni_plat_cv_init(&thr->cv,&thr->mtx);
  if (fn == (nni_thr_func)0x0) {
    thr->init = 1;
    thr->done = 1;
    thr_local._4_4_ = 0;
  }
  else {
    thr_local._4_4_ = nni_plat_thr_init(&thr->thr,nni_thr_wrap,thr);
    if (thr_local._4_4_ == 0) {
      thr->init = 1;
      thr_local._4_4_ = 0;
    }
    else {
      thr->done = 1;
      nni_plat_cv_fini(&thr->cv);
      nni_plat_mtx_fini(&thr->mtx);
    }
  }
  return thr_local._4_4_;
}

Assistant:

int
nni_thr_init(nni_thr *thr, nni_thr_func fn, void *arg)
{
	int rv;

	thr->done  = 0;
	thr->start = 0;
	thr->stop  = 0;
	thr->fn    = fn;
	thr->arg   = arg;

	nni_plat_mtx_init(&thr->mtx);
	nni_plat_cv_init(&thr->cv, &thr->mtx);

	if (fn == NULL) {
		thr->init = 1;
		thr->done = 1;
		return (0);
	}
	if ((rv = nni_plat_thr_init(&thr->thr, nni_thr_wrap, thr)) != 0) {
		thr->done = 1;
		nni_plat_cv_fini(&thr->cv);
		nni_plat_mtx_fini(&thr->mtx);
		return (rv);
	}
	thr->init = 1;
	return (0);
}